

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall
t_rb_generator::generate_rb_union
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct,bool is_exception)

{
  undefined1 *puVar1;
  t_rb_ofstream *ptVar2;
  ostream *poVar3;
  t_rb_generator *this_00;
  string sStack_48;
  
  generate_rdoc(this,out,(t_doc *)tstruct);
  ptVar2 = t_rb_ofstream::indent(out);
  poVar3 = std::operator<<((ostream *)ptVar2,"class ");
  type_name_abi_cxx11_(&sStack_48,this,&tstruct->super_t_type);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_48);
  poVar3 = std::operator<<(poVar3," < ::Thrift::Union");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_48);
  puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  ptVar2 = t_rb_ofstream::indent(out);
  this_00 = (t_rb_generator *)std::operator<<((ostream *)ptVar2,"include ::Thrift::Struct_Union");
  std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
  generate_field_constructors(this_00,out,tstruct);
  generate_field_constants(this,out,tstruct);
  generate_field_defns(this,out,tstruct);
  generate_rb_union_validator(this,out,tstruct);
  ptVar2 = t_rb_ofstream::indent(out);
  poVar3 = std::operator<<((ostream *)ptVar2,"::Thrift::Union.generate_accessors self");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  ptVar2 = t_rb_ofstream::indent(out);
  poVar3 = std::operator<<((ostream *)ptVar2,"end");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rb_generator::generate_rb_union(t_rb_ofstream& out,
                                       t_struct* tstruct,
                                       bool is_exception = false) {
  (void)is_exception;
  generate_rdoc(out, tstruct);
  out.indent() << "class " << type_name(tstruct) << " < ::Thrift::Union" << endl;

  out.indent_up();
  out.indent() << "include ::Thrift::Struct_Union" << endl;

  generate_field_constructors(out, tstruct);

  generate_field_constants(out, tstruct);
  generate_field_defns(out, tstruct);
  generate_rb_union_validator(out, tstruct);

  out.indent() << "::Thrift::Union.generate_accessors self" << endl;

  out.indent_down();
  out.indent() << "end" << endl << endl;
}